

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3Malloc(u64 n)

{
  ulong in_RDI;
  long in_FS_OFFSET;
  int unaff_retaddr;
  void *p;
  undefined1 *local_10;
  void **pp;
  
  pp = *(void ***)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  if ((in_RDI == 0) || (0x7ffffeff < in_RDI)) {
    local_10 = (undefined1 *)0x0;
  }
  else if (sqlite3Config.bMemstat == 0) {
    local_10 = (undefined1 *)(*sqlite3Config.m.xMalloc)((int)in_RDI);
  }
  else {
    sqlite3_mutex_enter((sqlite3_mutex *)0x1332b9);
    mallocWithAlarm(unaff_retaddr,pp);
    sqlite3_mutex_leave((sqlite3_mutex *)0x1332d6);
  }
  if (*(void ***)(in_FS_OFFSET + 0x28) != pp) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

SQLITE_PRIVATE void *sqlite3Malloc(u64 n){
  void *p;
  if( n==0 || n>SQLITE_MAX_ALLOCATION_SIZE ){
    p = 0;
  }else if( sqlite3GlobalConfig.bMemstat ){
    sqlite3_mutex_enter(mem0.mutex);
    mallocWithAlarm((int)n, &p);
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    p = sqlite3GlobalConfig.m.xMalloc((int)n);
  }
  assert( EIGHT_BYTE_ALIGNMENT(p) );  /* IMP: R-11148-40995 */
  return p;
}